

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void tcu::anon_unknown_75::writeUint32Low8(deUint8 *dst,deUint8 val)

{
  deUint32 uint32ByteOffsetBits0To8;
  deUint8 val_local;
  deUint8 *dst_local;
  
  *dst = val;
  return;
}

Assistant:

inline void writeUint32Low8 (deUint8* dst, deUint8 val)
{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
	const deUint32 uint32ByteOffsetBits0To8	= 0; //!< least significant byte in the lowest address
#else
	const deUint32 uint32ByteOffsetBits0To8	= 3; //!< least significant byte in the highest address
#endif

	dst[uint32ByteOffsetBits0To8] = val;
}